

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Parser * __thiscall Catch::Clara::Parser::operator|=(Parser *this,Parser *other)

{
  iterator __first;
  const_iterator __last;
  const_iterator this_00;
  Parser *in_RDI;
  vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *this_01;
  __normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
  *in_stack_ffffffffffffff90;
  vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *this_02;
  const_iterator in_stack_ffffffffffffffe8;
  
  this_01 = &in_RDI->m_options;
  __first = std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::end(this_01);
  __gnu_cxx::
  __normal_iterator<Catch::Clara::Opt_const*,std::vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>>>
  ::__normal_iterator<Catch::Clara::Opt*>
            (in_stack_ffffffffffffff90,
             (__normal_iterator<Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
              *)this_01);
  __last = std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::begin(this_01);
  this_00 = std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::end(this_01);
  std::vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>>::
  insert<__gnu_cxx::__normal_iterator<Catch::Clara::Opt_const*,std::vector<Catch::Clara::Opt,std::allocator<Catch::Clara::Opt>>>,void>
            ((vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *)this_00._M_current,
             in_stack_ffffffffffffffe8,
             (__normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
              )__first._M_current,
             (__normal_iterator<const_Catch::Clara::Opt_*,_std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>_>
              )__last._M_current);
  this_02 = &in_RDI->m_args;
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::end
            ((vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *)this_01);
  __gnu_cxx::
  __normal_iterator<Catch::Clara::Arg_const*,std::vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>>>
  ::__normal_iterator<Catch::Clara::Arg*>
            ((__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
              *)this_02,
             (__normal_iterator<Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
              *)this_01);
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::begin
            ((vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *)this_01);
  std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::end
            ((vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *)this_01);
  std::vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>>::
  insert<__gnu_cxx::__normal_iterator<Catch::Clara::Arg_const*,std::vector<Catch::Clara::Arg,std::allocator<Catch::Clara::Arg>>>,void>
            ((vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *)this_00._M_current,
             (const_iterator)in_stack_ffffffffffffffe8._M_current,
             (__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
              )__first._M_current,
             (__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
              )__last._M_current);
  return in_RDI;
}

Assistant:

Parser& Parser::operator|=( Parser const& other ) {
            m_options.insert( m_options.end(),
                              other.m_options.begin(),
                              other.m_options.end() );
            m_args.insert(
                m_args.end(), other.m_args.begin(), other.m_args.end() );
            return *this;
        }